

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponential_dist.hpp
# Opt level: O2

result_type_conflict2 __thiscall
trng::exponential_dist<double>::icdf(exponential_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  int *piVar2;
  double dVar3;
  
  if (0.0 <= x) {
    if (x <= 1.0) {
      if ((x == 1.0) && (!NAN(x))) {
        return INFINITY;
      }
      dVar1 = (this->P).mu_;
      dVar3 = log(1.0 - x);
      return dVar3 * -dVar1;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0x21;
  return NAN;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return -P.mu() * math::ln(1 - x);
    }